

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop
          (KcpTcpEventLoop *this,TcpConnectionPtr *tcpConn)

{
  bool bVar1;
  LogLevel LVar2;
  uint32_t uVar3;
  LogStream *pLVar4;
  self *psVar5;
  element_type *peVar6;
  string *psVar7;
  pointer ppVar8;
  element_type *peVar9;
  element_type *peVar10;
  pointer ppVar11;
  element_type *peVar12;
  sockaddr_in *__x;
  SourceFile file;
  SourceFile file_00;
  code *local_2128;
  undefined8 local_2120;
  type local_2118;
  Functor local_20f8;
  code *local_20d8;
  undefined8 local_20d0;
  type local_20c8;
  Functor local_20a8;
  InetAddress local_2084;
  undefined1 local_2068 [12];
  Logger local_2058;
  undefined1 local_1088 [8];
  KcpConnectionPtr kcpConn;
  type local_1068;
  Functor local_1048;
  _Self local_1028;
  _Self local_1020;
  iterator fKcpIter;
  _Self local_1010;
  iterator fTcpIter;
  uint32_t conv;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  __shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *local_18;
  TcpConnectionPtr *tcpConn_local;
  KcpTcpEventLoop *this_local;
  
  local_18 = &tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
  tcpConn_local = (TcpConnectionPtr *)this;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 3) {
    Logger::SourceFile::SourceFile<106>
              ((SourceFile *)local_ff8,
               (char (*) [106])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    Logger::Logger(&local_fe8,file,0x28);
    pLVar4 = Logger::stream(&local_fe8);
    psVar5 = LogStream::operator<<(pLVar4,"KcpTcpEventLoop::removeConnectionInLoop [");
    psVar5 = LogStream::operator<<(psVar5,&this->m_name);
    psVar5 = LogStream::operator<<(psVar5,"] - connection ");
    peVar6 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_18);
    psVar7 = TcpConnection::name_abi_cxx11_(peVar6);
    psVar5 = LogStream::operator<<(psVar5,psVar7);
    psVar5 = LogStream::operator<<(psVar5," - ");
    peVar6 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_18);
    uVar3 = TcpConnection::id(peVar6);
    LogStream::operator<<(psVar5,uVar3);
    Logger::~Logger(&local_fe8);
  }
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  peVar6 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  fTcpIter._M_node._0_4_ = TcpConnection::id(peVar6);
  local_1010._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
       ::find(&this->m_tcpConnections,(key_type *)&fTcpIter);
  fKcpIter._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
       ::end(&this->m_tcpConnections);
  bVar1 = std::operator!=(&local_1010,(_Self *)&fKcpIter);
  if (!bVar1) {
    __assert_fail("fTcpIter != m_tcpConnections.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                  ,0x2e,
                  "void sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr &)"
                 );
  }
  ppVar8 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
           ::operator->(&local_1010);
  peVar9 = std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(ppVar8->second).
                       super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  peVar10 = std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
  if (peVar9 == peVar10) {
    std::
    map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
    ::erase(&this->m_tcpConnections,(key_type *)&fTcpIter);
    local_1020._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
         ::find(&this->m_kcpConnections,(key_type *)&fTcpIter);
    local_1028._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
         ::end(&this->m_kcpConnections);
    bVar1 = std::operator==(&local_1020,&local_1028);
    if (bVar1) {
      std::
      map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
      ::erase(&this->m_crypts,(key_type *)&fTcpIter);
      assertVessels(this);
      kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TcpConnection::connectDestroyed;
      std::
      bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>const&>
                (&local_1068,
                 (offset_in_TcpConnection_to_subr *)
                 &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<sznet::net::TcpConnection> *)local_18);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
                ((function<void()> *)&local_1048,&local_1068);
      EventLoop::queueInLoop(&this->super_EventLoop,&local_1048);
      std::function<void_()>::~function(&local_1048);
      std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
      ::~_Bind(&local_1068);
    }
    else {
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>
                ::operator->(&local_1020);
      std::shared_ptr<sznet::net::KcpConnection>::shared_ptr
                ((shared_ptr<sznet::net::KcpConnection> *)local_1088,&ppVar11->second);
      LVar2 = Logger::logLevel();
      if ((int)LVar2 < 3) {
        Logger::SourceFile::SourceFile<106>
                  ((SourceFile *)local_2068,
                   (char (*) [106])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                  );
        file_00._12_4_ = 0;
        file_00.m_data = (char *)local_2068._0_8_;
        file_00.m_size = local_2068._8_4_;
        Logger::Logger(&local_2058,file_00,0x3e);
        pLVar4 = Logger::stream(&local_2058);
        psVar5 = LogStream::operator<<(pLVar4,"KcpTcpEventLoop::removeConnectionInLoop [");
        psVar5 = LogStream::operator<<(psVar5,&this->m_name);
        psVar5 = LogStream::operator<<(psVar5,"] - connection ");
        peVar12 = std::
                  __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1088);
        psVar7 = KcpConnection::name_abi_cxx11_(peVar12);
        psVar5 = LogStream::operator<<(psVar5,psVar7);
        psVar5 = LogStream::operator<<(psVar5," - ");
        peVar12 = std::
                  __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1088);
        uVar3 = KcpConnection::id(peVar12);
        pLVar4 = LogStream::operator<<(psVar5,uVar3);
        psVar5 = LogStream::operator<<(pLVar4,"- ");
        peVar12 = std::
                  __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1088);
        bVar1 = KcpConnection::connected(peVar12);
        LogStream::operator<<(psVar5,bVar1);
        Logger::~Logger(&local_2058);
      }
      std::
      map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
      ::erase(&this->m_crypts,(key_type *)&fTcpIter);
      peVar12 = std::
                __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1088);
      KcpConnection::peerAddress(&local_2084,peVar12);
      __x = InetAddress::getSockAddrIn(&local_2084);
      std::
      unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
      ::erase(&this->m_addrConns,__x);
      local_20d8 = TcpConnection::connectDestroyed;
      local_20d0 = 0;
      std::
      bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>const&>
                (&local_20c8,(offset_in_TcpConnection_to_subr *)&local_20d8,
                 (shared_ptr<sznet::net::TcpConnection> *)local_18);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
                ((function<void()> *)&local_20a8,&local_20c8);
      EventLoop::queueInLoop(&this->super_EventLoop,&local_20a8);
      std::function<void_()>::~function(&local_20a8);
      std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
      ::~_Bind(&local_20c8);
      local_2128 = KcpConnection::forceCloseInLoop;
      local_2120 = 0;
      std::bind<void(sznet::net::KcpConnection::*)(),std::shared_ptr<sznet::net::KcpConnection>&>
                (&local_2118,(offset_in_KcpConnection_to_subr *)&local_2128,
                 (shared_ptr<sznet::net::KcpConnection> *)local_1088);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>,void>
                ((function<void()> *)&local_20f8,&local_2118);
      EventLoop::runInLoop(&this->super_EventLoop,&local_20f8);
      std::function<void_()>::~function(&local_20f8);
      std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>
      ::~_Bind(&local_2118);
      std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
                ((shared_ptr<sznet::net::KcpConnection> *)local_1088);
    }
    return;
  }
  __assert_fail("fTcpIter->second.get() == tcpConn.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                ,0x2f,
                "void sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr &)"
               );
}

Assistant:

void KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr& tcpConn)
{
	LOG_INFO << "KcpTcpEventLoop::removeConnectionInLoop [" << m_name
		<< "] - connection " << tcpConn->name() << " - " << tcpConn->id();

	assertInLoopThread();
	uint32_t conv = tcpConn->id();
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(conv);
	assert(fTcpIter != m_tcpConnections.end());
	assert(fTcpIter->second.get() == tcpConn.get());
	m_tcpConnections.erase(conv);
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(conv);
	if (fKcpIter == m_kcpConnections.end())
	{
		// 说明这个时候客户端还没有回执校验就断开了 或者 KCP主动断掉连接了
		// 有可能有，有可能没有，都删除一下
		m_crypts.erase(conv);
		assertVessels();
		queueInLoop(std::bind(&TcpConnection::connectDestroyed, tcpConn));
	}
	else
	{
		KcpConnectionPtr kcpConn = fKcpIter->second;

		LOG_INFO << "KcpTcpEventLoop::removeConnectionInLoop [" << m_name
			<< "] - connection " << kcpConn->name() << " - " << kcpConn->id() << 
			"- " << kcpConn->connected();

		// kcp conn 存在，但是也有可能没有连接成功
		m_crypts.erase(conv);
		m_addrConns.erase(*kcpConn->peerAddress().getSockAddrIn());
		// 这里不处理 m_kcpConnections
		queueInLoop(std::bind(&TcpConnection::connectDestroyed, tcpConn));
		runInLoop(std::bind(&KcpConnection::forceCloseInLoop, kcpConn));
	}
}